

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloca.hpp
# Opt level: O2

void __thiscall
libtorrent::aux::alloca_destructor<libtorrent::span<char>_>::~alloca_destructor
          (alloca_destructor<libtorrent::span<char>_> *this)

{
  span<char> *psVar1;
  
  if ((0x100 < (this->objects).m_len) &&
     (psVar1 = (this->objects).m_ptr, psVar1 != (span<char> *)0x0)) {
    operator_delete__(psVar1);
    return;
  }
  return;
}

Assistant:

~alloca_destructor()
	{
		if (objects.size() > cutoff)
		{
			delete [] objects.data();
		}
		else
		{
			for (auto& o : objects)
			{
				TORRENT_UNUSED(o);
				o.~T();
			}
		}
	}